

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cpp
# Opt level: O3

void dlib::impl1::connect_all
               (map_id_to_con *cons,
               vector<dlib::network_address,_std::allocator<dlib::network_address>_> *hosts,
               unsigned_long node_id)

{
  binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
  *this;
  bsp_con *this_00;
  pointer *__ptr;
  long lVar1;
  long lVar2;
  ulong uVar3;
  unsigned_long id;
  _Head_base<0UL,_dlib::impl1::bsp_con_*,_false> local_48;
  ulong local_40;
  unsigned_long local_38;
  
  this = (binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
          *)(cons + 0x10);
  local_38 = node_id;
  if (*(long *)(cons + 0x38) != 0) {
    binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
    ::delete_tree(this,*(node **)(cons + 0x40));
    *(undefined2 *)(cons + 0x60) = 0;
    *(undefined8 *)(cons + 0x38) = 0;
    *(undefined8 *)(cons + 0x40) = 0;
  }
  (**(code **)(*(long *)this + 0x18))(this);
  lVar1 = *(long *)hosts;
  if (*(long *)(hosts + 8) != lVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      this_00 = (bsp_con *)operator_new(400);
      bsp_con::bsp_con(this_00,(network_address *)(lVar1 + lVar2));
      local_48._M_head_impl = this_00;
      serialize(&local_38,
                (ostream *)
                &(this_00->stream).super_basic_istream<char,_std::char_traits<char>_>.field_0x10);
      uVar3 = uVar3 + 1;
      local_40 = uVar3;
      map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
      ::add(cons,&local_40,(range *)&local_48);
      if (local_48._M_head_impl != (bsp_con *)0x0) {
        std::default_delete<dlib::impl1::bsp_con>::operator()
                  ((default_delete<dlib::impl1::bsp_con> *)&local_48,local_48._M_head_impl);
      }
      lVar1 = *(long *)hosts;
      lVar2 = lVar2 + 0x28;
    } while (uVar3 < (ulong)((*(long *)(hosts + 8) - lVar1 >> 3) * -0x3333333333333333));
  }
  return;
}

Assistant:

void connect_all (
            map_id_to_con& cons,
            const std::vector<network_address>& hosts,
            unsigned long node_id
        )
        {
            cons.clear();
            for (unsigned long i = 0; i < hosts.size(); ++i)
            {
                std::unique_ptr<bsp_con> con(new bsp_con(hosts[i]));
                dlib::serialize(node_id, con->stream); // tell the other end our node_id
                unsigned long id = i+1;
                cons.add(id, con);
            }
        }